

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list.hpp
# Opt level: O2

void __thiscall
pstore::broker::intrusive_list<(anonymous_namespace)::value>::intrusive_list
          (intrusive_list<(anonymous_namespace)::value> *this)

{
  _Head_base<0UL,_(anonymous_namespace)::value_*,_false> _Var1;
  value *pvVar2;
  
  _Var1._M_head_impl = (value *)operator_new(0x18);
  (_Var1._M_head_impl)->v = 0;
  ((_Var1._M_head_impl)->list_memb).prev = (value *)0x0;
  *(value **)((long)&(_Var1._M_head_impl)->list_memb + 8) = (value *)0x0;
  (this->head_)._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
  .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl = _Var1._M_head_impl;
  pvVar2 = (value *)operator_new(0x18);
  pvVar2->v = 0;
  (pvVar2->list_memb).next = (value *)0x0;
  (this->tail_)._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
  .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl = pvVar2;
  *(value **)((long)&(_Var1._M_head_impl)->list_memb + 8) = pvVar2;
  (pvVar2->list_memb).prev = _Var1._M_head_impl;
  return;
}

Assistant:

intrusive_list<T>::intrusive_list ()
                : head_{std::unique_ptr<T> (new T)}
                , tail_{std::unique_ptr<T> (new T)} {
            head_->get_list_member ().next = tail_.get ();
            tail_->get_list_member ().prev = head_.get ();
        }